

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O0

string * __thiscall ADSBHubConnection::GetStatusText_abi_cxx11_(ADSBHubConnection *this)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  type this_00;
  long *in_RSI;
  string *in_RDI;
  rep_conflict rVar4;
  duration<double,_std::ratio<1L,_1L>_> diff;
  char t [100];
  string *s;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffef8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff00;
  char *__s;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff08;
  duration<double,_std::ratio<1L,_1L>_> local_a0;
  char local_98 [48];
  LTChannel *in_stack_ffffffffffffff98;
  
  LTChannel::GetStatusText_abi_cxx11_(in_stack_ffffffffffffff98);
  bVar1 = (**(code **)(*in_RSI + 0x30))();
  if (((bVar1 & 1) == 0) && ((int)in_RSI[0x4e] == 3)) {
    std::__cxx11::string::operator+=
              ((string *)in_RDI,
               ", had received no data, verify ADSBHub \'Data Access\' configuration!");
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)in_RDI," Your public IP address appears to be ");
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)(in_RSI + 0x4a));
    }
  }
  else {
    bVar2 = LTChannel::isRunning((LTChannel *)0x187215);
    if (bVar2) {
      if ((int)in_RSI[0x4e] == 1) {
        std::__cxx11::string::operator+=((string *)in_RDI," | SBS format");
      }
      else if ((int)in_RSI[0x4e] == 2) {
        std::__cxx11::string::operator+=((string *)in_RDI," | Compressed VRS format");
      }
      else {
        std::__cxx11::string::operator+=((string *)in_RDI," | connecting...");
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point(in_stack_ffffffffffffff00);
      bVar2 = std::chrono::operator!=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      if (bVar2) {
        std::chrono::_V2::steady_clock::now();
        this_00 = std::chrono::operator-(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        std::chrono::duration<double,std::ratio<1l,1l>>::
        duration<long,std::ratio<1l,1000000000l>,void>
                  ((duration<double,_std::ratio<1L,_1L>_> *)this_00.__r,
                   &in_stack_ffffffffffffff08->__d);
        __s = local_98;
        rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_a0);
        snprintf(__s,100," | last msg %.0fs ago",rVar4);
        std::__cxx11::string::operator+=((string *)in_RDI,local_98);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::string ADSBHubConnection::GetStatusText () const
{
    // Let's start with the standard text
    std::string s (LTChannel::GetStatusText());
    // add format of data being received
    if (!IsValid() && eFormat == FMT_NULL_DATA) {
        s += ", had received no data, verify ADSBHub 'Data Access' configuration!";
        if (!sPublicIPv4addr.empty()) {
            s += " Your public IP address appears to be ";
            s += sPublicIPv4addr;
        }
    }
    else if (isRunning()) {
        switch (eFormat) {
            case FMT_SBS:       s += " | SBS format"; break;
            case FMT_ComprVRS:  s += " | Compressed VRS format"; break;
            default:            s += " | connecting...";
        }
        // add time since last data
        if (lastData != std::chrono::time_point<std::chrono::steady_clock>()) {
            char t[100];
            std::chrono::duration<double> diff = std::chrono::steady_clock::now() - lastData;
            snprintf(t, sizeof(t), " | last msg %.0fs ago", diff.count());
            s += t;
        }
    }
    return s;
}